

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthMux(uint *pOut,uint *pCof0,uint *pCof1,int nVars,int iVar)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x268,
                  "void Extra_TruthMux(unsigned int *, unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xaaaaaaaa | pCof0[uVar1] & 0x55555555;
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    break;
  case 1:
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xcccccccc | pCof0[uVar1] & 0x33333333;
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    break;
  case 2:
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xf0f0f0f0 | pCof0[uVar1] & 0xf0f0f0f;
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    break;
  case 3:
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xff00ff00 | pCof0[uVar1] & 0xff00ff;
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    break;
  case 4:
    if (0 < (int)uVar4) {
      uVar1 = 0;
      do {
        pOut[uVar1] = CONCAT22(*(undefined2 *)((long)pCof1 + uVar1 * 4 + 2),(short)pCof0[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar4 != uVar1);
    }
    break;
  default:
    if (0 < (int)uVar4) {
      bVar2 = (byte)(iVar + -5);
      uVar6 = 1 << (bVar2 & 0x1f);
      iVar5 = 2 << (bVar2 & 0x1f);
      uVar1 = 1;
      if (1 < (int)uVar6) {
        uVar1 = (ulong)uVar6;
      }
      puVar7 = pOut + (int)uVar6;
      iVar3 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar8 = 0;
          do {
            pOut[uVar8] = pCof0[uVar8];
            puVar7[uVar8] = pCof1[(long)(int)uVar6 + uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
        iVar3 = iVar3 + iVar5;
        puVar7 = puVar7 + iVar5;
        pOut = pOut + iVar5;
      } while (iVar3 < (int)uVar4);
    }
  }
  return;
}

Assistant:

void Extra_TruthMux( unsigned * pOut, unsigned * pCof0, unsigned * pCof1, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x55555555) | (pCof1[i] & 0xAAAAAAAA);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x33333333) | (pCof1[i] & 0xCCCCCCCC);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0F0F0F0F) | (pCof1[i] & 0xF0F0F0F0);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x00FF00FF) | (pCof1[i] & 0xFF00FF00);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0000FFFF) | (pCof1[i] & 0xFFFF0000);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pOut[i]      = pCof0[i];
                pOut[Step+i] = pCof1[Step+i];
            }
            pOut += 2*Step;
        }
        return;
    }
}